

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-builder.h
# Opt level: O3

LogicalExpr __thiscall
mp::ProblemBuilder<TestProblemBuilder,_BasicTestExpr<0>_>::MakeLogicalCount
          (ProblemBuilder<TestProblemBuilder,_BasicTestExpr<0>_> *this,Kind kind,NumericExpr lhs,
          CountExpr rhs)

{
  allocator<char> local_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,internal::ExprInfo::INFO[kind].str,&local_31);
  TestProblemBuilder::ReportUnhandledConstruct((TestProblemBuilder *)this,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return (LogicalExpr)NULL_ID;
}

Assistant:

LogicalExpr MakeLogicalCount(
      expr::Kind kind, NumericExpr lhs, CountExpr rhs) {
    internal::Unused(kind, &lhs, &rhs);
    MP_DISPATCH(ReportUnhandledConstruct(str(kind)));
    return LogicalExpr();
  }